

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cubeb_sndio.c
# Opt level: O1

int sndio_stream_init(cubeb_conflict2 *context,cubeb_stream_conflict2 **stream,char *stream_name,
                     cubeb_devid input_device,cubeb_stream_params *input_stream_params,
                     cubeb_devid output_device,cubeb_stream_params *output_stream_params,
                     uint latency_frames,cubeb_data_callback_conflict2 data_callback,
                     cubeb_state_callback_conflict2 state_callback,void *user_ptr)

{
  uint uVar1;
  _func_sio_hdl_ptr_char_ptr_uint_int *p_Var2;
  uint32_t uVar3;
  int iVar4;
  cubeb_stream_conflict2 *__s;
  void *pvVar5;
  char *pcVar6;
  sio_hdl *psVar7;
  uchar *puVar8;
  char *pcVar9;
  ulong uVar10;
  sio_par wpar;
  cubeb_sample_format local_c0;
  sio_par local_b0;
  sio_par local_70;
  
  __s = (cubeb_stream_conflict2 *)malloc(0xa8);
  if (__s == (cubeb_stream_conflict2 *)0x0) {
    return -1;
  }
  pvVar5 = memset(__s,0,0xa8);
  uVar3 = (uint32_t)pvVar5;
  if (input_stream_params != (cubeb_stream_params *)0x0) {
    if ((input_stream_params->prefs & CUBEB_STREAM_PREF_LOOPBACK) != CUBEB_STREAM_PREF_NONE)
    goto LAB_0010ae76;
    __s->mode = 2;
    local_c0 = input_stream_params->format;
    uVar3 = input_stream_params->rate;
  }
  if (output_stream_params != (cubeb_stream_params *)0x0) {
    if ((output_stream_params->prefs & CUBEB_STREAM_PREF_LOOPBACK) != CUBEB_STREAM_PREF_NONE)
    goto LAB_0010ae76;
    *(byte *)&__s->mode = (byte)__s->mode | 1;
    local_c0 = output_stream_params->format;
    uVar3 = output_stream_params->rate;
  }
  uVar1 = __s->mode;
  if (uVar1 != 0) {
    __s->context = context;
    p_Var2 = cubeb_sio_open;
    pcVar6 = getenv("AUDIODEVICE");
    if (pcVar6 == (char *)0x0) {
      pcVar9 = "snd/0";
    }
    else {
      pcVar9 = "snd/0";
      if (*pcVar6 != '\0') {
        pcVar9 = pcVar6;
      }
    }
    psVar7 = (*p_Var2)(pcVar9,uVar1,1);
    __s->hdl = psVar7;
    if (psVar7 != (sio_hdl *)0x0) {
      (*cubeb_sio_initpar)(&local_70);
      local_70.sig = 1;
      local_70.bits = 0x10;
      if (local_c0 < CUBEB_SAMPLE_FLOAT32BE) {
        local_70.le = *(uint *)(&DAT_0010e9ec + (ulong)local_c0 * 4);
        if ((__s->mode & 2U) != 0) {
          local_70.rchan = input_stream_params->channels;
        }
        if ((__s->mode & 1U) != 0) {
          local_70.pchan = output_stream_params->channels;
        }
        local_70.appbufsz = latency_frames;
        local_70.rate = uVar3;
        iVar4 = (*cubeb_sio_setpar)(__s->hdl,&local_70);
        if ((((((iVar4 != 0) && (iVar4 = (*cubeb_sio_getpar)(__s->hdl,&local_b0), iVar4 != 0)) &&
              (local_b0.bits == local_70.bits)) &&
             ((local_b0.le == local_70.le && (local_b0.sig == local_70.sig)))) &&
            ((local_b0.rate == local_70.rate &&
             (((__s->mode & 2U) == 0 || (local_b0.rchan == local_70.rchan)))))) &&
           (((__s->mode & 1U) == 0 || (local_b0.pchan == local_70.pchan)))) {
          (*cubeb_sio_onmove)(__s->hdl,sndio_onmove,__s);
          __s->active = 0;
          __s->nfr = local_b0.round;
          uVar10 = (ulong)local_b0.bps;
          __s->rbpf = local_b0.rchan * local_b0.bps;
          __s->pbpf = local_b0.pchan * local_b0.bps;
          __s->rchan = local_b0.rchan;
          __s->pchan = local_b0.pchan;
          __s->nblks = local_b0.bufsz / local_b0.round;
          __s->data_cb = data_callback;
          __s->state_cb = state_callback;
          __s->arg = user_ptr;
          __s->hwpos = 0;
          __s->swpos = 0;
          (__s->mtx).__align = 0;
          *(undefined8 *)((long)&__s->mtx + 8) = 0;
          *(undefined8 *)((long)&__s->mtx + 0x10) = 0;
          (__s->mtx).__data.__list.__prev = (__pthread_internal_list *)0x0;
          (__s->mtx).__data.__list.__next = (__pthread_internal_list *)0x0;
          if (local_c0 == CUBEB_SAMPLE_FLOAT32LE) {
            __s->conv = 1;
            uVar10 = 4;
          }
          else {
            __s->conv = 0;
          }
          uVar1 = __s->mode;
          if ((uVar1 & 1) != 0) {
            puVar8 = (uchar *)malloc((ulong)local_b0.pchan * (ulong)local_b0.round * uVar10);
            __s->pbuf = puVar8;
            if (puVar8 == (uchar *)0x0) goto LAB_0010ae76;
          }
          if ((uVar1 & 2) != 0) {
            puVar8 = (uchar *)malloc((ulong)local_b0.rchan * (ulong)local_b0.round * uVar10);
            __s->rbuf = puVar8;
            if (puVar8 == (uchar *)0x0) goto LAB_0010ae76;
          }
          __s->volume = 1.0;
          *stream = __s;
          return 0;
        }
      }
    }
  }
LAB_0010ae76:
  if (__s->hdl != (sio_hdl *)0x0) {
    (*cubeb_sio_close)(__s->hdl);
  }
  if (__s->pbuf != (uchar *)0x0) {
    free(__s->pbuf);
  }
  if (__s->rbuf != (uchar *)0x0) {
    free(__s->pbuf);
  }
  free(__s);
  return -1;
}

Assistant:

static int
sndio_stream_init(cubeb * context,
                  cubeb_stream ** stream,
                  char const * stream_name,
                  cubeb_devid input_device,
                  cubeb_stream_params * input_stream_params,
                  cubeb_devid output_device,
                  cubeb_stream_params * output_stream_params,
                  unsigned int latency_frames,
                  cubeb_data_callback data_callback,
                  cubeb_state_callback state_callback,
                  void *user_ptr)
{
  cubeb_stream *s;
  struct sio_par wpar, rpar;
  cubeb_sample_format format;
  int rate;
  size_t bps;

  DPR("sndio_stream_init(%s)\n", stream_name);

  s = malloc(sizeof(cubeb_stream));
  if (s == NULL)
    return CUBEB_ERROR;
  memset(s, 0, sizeof(cubeb_stream));
  s->mode = 0;
  if (input_stream_params) {
    if (input_stream_params->prefs & CUBEB_STREAM_PREF_LOOPBACK) {
      DPR("sndio_stream_init(), loopback not supported\n");
      goto err;
    }
    s->mode |= SIO_REC;
    format = input_stream_params->format;
    rate = input_stream_params->rate;
  }
  if (output_stream_params) {
    if (output_stream_params->prefs & CUBEB_STREAM_PREF_LOOPBACK) {
      DPR("sndio_stream_init(), loopback not supported\n");
      goto err;
    }
    s->mode |= SIO_PLAY;
    format = output_stream_params->format;
    rate = output_stream_params->rate;
  }
  if (s->mode == 0) {
    DPR("sndio_stream_init(), neither playing nor recording\n");
    goto err;
  }
  s->context = context;
  s->hdl = WRAP(sio_open)(sndio_get_device(), s->mode, 1);
  if (s->hdl == NULL) {
    DPR("sndio_stream_init(), sio_open() failed\n");
    goto err;
  }
  WRAP(sio_initpar)(&wpar);
  wpar.sig = 1;
  wpar.bits = 16;
  switch (format) {
  case CUBEB_SAMPLE_S16LE:
    wpar.le = 1;
    break;
  case CUBEB_SAMPLE_S16BE:
    wpar.le = 0;
    break;
  case CUBEB_SAMPLE_FLOAT32NE:
    wpar.le = SIO_LE_NATIVE;
    break;
  default:
    DPR("sndio_stream_init() unsupported format\n");
    goto err;
  }
  wpar.rate = rate;
  if (s->mode & SIO_REC)
    wpar.rchan = input_stream_params->channels;
  if (s->mode & SIO_PLAY)
    wpar.pchan = output_stream_params->channels;
  wpar.appbufsz = latency_frames;
  if (!WRAP(sio_setpar)(s->hdl, &wpar) || !WRAP(sio_getpar)(s->hdl, &rpar)) {
    DPR("sndio_stream_init(), sio_setpar() failed\n");
    goto err;
  }
  if (rpar.bits != wpar.bits || rpar.le != wpar.le ||
      rpar.sig != wpar.sig || rpar.rate != wpar.rate ||
      ((s->mode & SIO_REC) && rpar.rchan != wpar.rchan) ||
      ((s->mode & SIO_PLAY) && rpar.pchan != wpar.pchan)) {
    DPR("sndio_stream_init() unsupported params\n");
    goto err;
  }
  WRAP(sio_onmove)(s->hdl, sndio_onmove, s);
  s->active = 0;
  s->nfr = rpar.round;
  s->rbpf = rpar.bps * rpar.rchan;
  s->pbpf = rpar.bps * rpar.pchan;
  s->rchan = rpar.rchan;
  s->pchan = rpar.pchan;
  s->nblks = rpar.bufsz / rpar.round;
  s->data_cb = data_callback;
  s->state_cb = state_callback;
  s->arg = user_ptr;
  s->mtx = (pthread_mutex_t)PTHREAD_MUTEX_INITIALIZER;
  s->hwpos = s->swpos = 0;
  if (format == CUBEB_SAMPLE_FLOAT32LE) {
    s->conv = 1;
    bps = sizeof(float);
  } else {
    s->conv = 0;
    bps = rpar.bps;
  }
  if (s->mode & SIO_PLAY) {
    s->pbuf = malloc(bps * rpar.pchan * rpar.round);
    if (s->pbuf == NULL)
      goto err;
  }
  if (s->mode & SIO_REC) {
    s->rbuf = malloc(bps * rpar.rchan * rpar.round);
    if (s->rbuf == NULL)
      goto err;
  }
  s->volume = 1.;
  *stream = s;
  DPR("sndio_stream_init() end, ok\n");
  (void)context;
  (void)stream_name;
  return CUBEB_OK;
err:
  if (s->hdl)
    WRAP(sio_close)(s->hdl);
  if (s->pbuf)
    free(s->pbuf);
  if (s->rbuf)
    free(s->pbuf);
  free(s);
  return CUBEB_ERROR;
}